

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  undefined8 *puVar3;
  _Bool _Var4;
  CURLcode CVar5;
  uint uVar6;
  CURLcode CVar7;
  uint err;
  int iVar8;
  BIO_METHOD *type;
  BIO *pBVar9;
  ssl_config_data *psVar10;
  long lVar11;
  char *pcVar12;
  SSL_CIPHER *c;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  int *piVar16;
  uchar **buf_00;
  char *pcVar17;
  void *pvVar18;
  size_t nwritten;
  size_t blen;
  uchar *buf;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uchar *neg_protocol;
  uchar auStack_130 [256];
  
  pvVar1 = cf->ctx;
  if (*(int *)((long)pvVar1 + 0xb8) == 3) {
    CVar5 = CURLE_OK;
    _Var4 = true;
    goto LAB_0016bbb5;
  }
  *done = false;
  *(undefined4 *)((long)pvVar1 + 0xc4) = 0;
  iVar8 = *(int *)((long)pvVar1 + 0xbc);
  if (iVar8 == 0) {
    pvVar18 = pvVar1;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, step1");
      pvVar18 = cf->ctx;
    }
    octx = *(ossl_ctx **)((long)pvVar18 + 0x40);
    CVar7 = Curl_ossl_ctx_init(octx,cf,data,(ssl_peer *)((long)pvVar18 + 8),
                               *(alpn_spec **)((long)pvVar18 + 0x38),(Curl_ossl_ctx_setup_cb *)0x0,
                               (void *)0x0,ossl_new_session_cb,cf,ossl_on_session_reuse);
    if (CVar7 == CURLE_OK) {
      type = (BIO_METHOD *)BIO_meth_new(0x401,"OpenSSL CF BIO");
      CVar7 = CURLE_OUT_OF_MEMORY;
      if (type == (BIO_METHOD *)0x0) {
        octx->bio_method = (BIO_METHOD *)0x0;
      }
      else {
        BIO_meth_set_write(type,ossl_bio_cf_out_write);
        BIO_meth_set_read(type,ossl_bio_cf_in_read);
        BIO_meth_set_ctrl(type,ossl_bio_cf_ctrl);
        BIO_meth_set_create(type,ossl_bio_cf_create);
        BIO_meth_set_destroy(type,ossl_bio_cf_destroy);
        octx->bio_method = (BIO_METHOD *)type;
        pBVar9 = BIO_new(type);
        if (pBVar9 != (BIO *)0x0) {
          BIO_set_data(pBVar9,cf);
          BIO_up_ref(pBVar9);
          SSL_set0_rbio(octx->ssl,pBVar9);
          SSL_set0_wbio(octx->ssl,pBVar9);
          if ((*(alpn_spec **)((long)pvVar18 + 0x38) != (alpn_spec *)0x0) &&
             (*(int *)((long)pvVar18 + 0xb8) != 1)) {
            auStack_130[8] = '\0';
            auStack_130[9] = '\0';
            auStack_130[10] = '\0';
            auStack_130[0xb] = '\0';
            auStack_130[0xc] = '\0';
            auStack_130[0xd] = '\0';
            auStack_130[0xe] = '\0';
            auStack_130[0xf] = '\0';
            auStack_130[0x10] = '\0';
            auStack_130[0x11] = '\0';
            auStack_130[0x12] = '\0';
            auStack_130[0x13] = '\0';
            auStack_130[0x14] = '\0';
            auStack_130[0x15] = '\0';
            auStack_130[0x16] = '\0';
            auStack_130[0x17] = '\0';
            neg_protocol = (uchar *)0x0;
            auStack_130[0] = '\0';
            auStack_130[1] = '\0';
            auStack_130[2] = '\0';
            auStack_130[3] = '\0';
            auStack_130[4] = '\0';
            auStack_130[5] = '\0';
            auStack_130[6] = '\0';
            auStack_130[7] = '\0';
            auStack_130._24_8_ = 0;
            Curl_alpn_to_proto_str
                      ((alpn_proto_buf *)&neg_protocol,*(alpn_spec **)((long)pvVar18 + 0x38));
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              Curl_infof(data,"ALPN: curl offers %s",&neg_protocol);
            }
          }
          *(undefined4 *)((long)pvVar18 + 0xbc) = 1;
          iVar8 = *(int *)((long)pvVar1 + 0xbc);
          goto LAB_0016b22a;
        }
      }
      goto LAB_0016bba3;
    }
LAB_0016bb97:
    _Var4 = false;
    CVar5 = CURLE_OK;
    if (CVar7 == CURLE_AGAIN) goto LAB_0016bbb5;
    goto LAB_0016bba3;
  }
LAB_0016b22a:
  if (iVar8 == 1) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, step2");
    }
    if (*(int *)((long)pvVar1 + 0xc0) == 1) goto LAB_0016b99c;
    if (*(int *)((long)pvVar1 + 0xc0) == 2) {
      pvVar18 = cf->ctx;
      lVar11 = *(long *)((long)pvVar18 + 0x40);
      *(undefined4 *)(lVar11 + 0x20) = 0;
LAB_0016b2c3:
      _Var4 = Curl_bufq_peek((bufq *)((long)pvVar18 + 0x68),&buf,&blen);
      if (_Var4) {
        uVar6 = SSL_write_early_data
                          (*(undefined8 *)(lVar11 + 8),buf,CONCAT44(blen._4_4_,(uint)blen));
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"SSL_write_early_data(len=%zu) -> %d, %zu",
                            CONCAT44(blen._4_4_,(uint)blen),(ulong)uVar6,0);
        }
        if (0 < (int)uVar6) goto code_r0x0016b354;
        iVar8 = SSL_get_error(*(SSL **)(lVar11 + 8),uVar6);
        switch(iVar8) {
        case 1:
          uVar14 = ERR_get_error();
          pcVar15 = ossl_strerror(uVar14,(char *)&neg_protocol,0x100);
          Curl_failf(data,"SSL_write_early_data() error: %s",pcVar15);
          break;
        case 2:
          *(undefined4 *)((long)pvVar18 + 0xc4) = 1;
          goto LAB_0016bb40;
        case 3:
          *(undefined4 *)((long)pvVar18 + 0xc4) = 2;
LAB_0016bb40:
          CVar7 = CURLE_AGAIN;
          goto LAB_0016bb97;
        default:
          pcVar15 = SSL_ERROR_to_str(iVar8);
          __errno_location();
          Curl_failf(data,"OpenSSL SSL_write_early_data: %s, errno %d",pcVar15);
          break;
        case 5:
          piVar16 = __errno_location();
          if (*(int *)(lVar11 + 0x20) == 0x51) {
            CVar7 = CURLE_AGAIN;
          }
          else {
            iVar8 = *piVar16;
            uVar14 = ERR_get_error();
            if (uVar14 == 0) {
              if (iVar8 == 0) {
                curl_msnprintf((char *)&neg_protocol,0x100,"%s","SSL_ERROR_SYSCALL");
              }
              else {
                Curl_strerror(iVar8,(char *)&neg_protocol,0x100);
              }
            }
            else {
              ossl_strerror(uVar14,(char *)&neg_protocol,0x100);
            }
            Curl_failf(data,"OpenSSL SSL_write:early_data: %s, errno %d",&neg_protocol);
            CVar7 = CURLE_SEND_ERROR;
          }
          goto LAB_0016bb97;
        }
        CVar7 = CURLE_SEND_ERROR;
        goto LAB_0016bb97;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"SSL sending %zu bytes of early data",*(undefined8 *)((long)pvVar18 + 0xb0))
        ;
      }
      *(undefined4 *)((long)pvVar1 + 0xc0) = 3;
    }
    connssl = (ssl_connect_data *)cf->ctx;
    puVar3 = (undefined8 *)connssl->backend;
    psVar10 = Curl_ssl_cf_get_config(cf,data);
    connssl->io_need = 0;
    ERR_clear_error();
    uVar6 = SSL_connect((SSL *)puVar3[1]);
    if ((*(byte *)((long)puVar3 + 0x24) & 1) == 0) {
      CVar7 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar3);
      if (CVar7 != CURLE_OK) goto LAB_0016bb97;
      *(byte *)((long)puVar3 + 0x24) = *(byte *)((long)puVar3 + 0x24) | 1;
    }
    if (uVar6 == 1) {
      buf = (uchar *)((ulong)buf._4_4_ << 0x20);
      connssl->connecting_state = ssl_connect_3;
      SSL_get_peer_signature_type_nid(puVar3[1]);
      lVar11 = SSL_ctrl((SSL *)puVar3[1],0x86,0,(void *)0x0);
      pcVar15 = OBJ_nid2sn((uint)lVar11 & 0xffff);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        pcVar12 = SSL_get_version((SSL *)puVar3[1]);
        c = SSL_get_current_cipher((SSL *)puVar3[1]);
        pcVar13 = SSL_CIPHER_get_name(c);
        pcVar17 = "[blank]";
        if (pcVar15 != (char *)0x0) {
          pcVar17 = pcVar15;
        }
        pcVar15 = OBJ_nid2sn((int)buf);
        Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar12,pcVar13,pcVar17,pcVar15);
      }
      if (connssl->alpn != (alpn_spec *)0x0) {
        SSL_get0_alpn_selected(puVar3[1],&neg_protocol,&blen);
        CVar7 = Curl_alpn_set_negotiated(cf,data,connssl,neg_protocol,(ulong)(uint)blen);
        if (CVar7 != CURLE_OK) goto LAB_0016bb97;
      }
      goto LAB_0016b87e;
    }
    err = SSL_get_error((SSL *)puVar3[1],uVar6);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"SSL_connect() -> err=%d, detail=%d",(ulong)uVar6,(ulong)err);
    }
    if (err == 0xc) {
      iVar8 = 1;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
          && (0 < cf->cft->log_level)))) {
        pcVar15 = "SSL_connect() -> want retry_verify";
LAB_0016ba5f:
        Curl_trc_cf_infof(data,cf,pcVar15);
      }
LAB_0016ba6b:
      connssl->io_need = iVar8;
      _Var4 = false;
      CVar5 = CURLE_OK;
      goto LAB_0016bbb5;
    }
    if (err == 3) {
      iVar8 = 2;
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        pcVar15 = "SSL_connect() -> want send";
        goto LAB_0016ba5f;
      }
      goto LAB_0016ba6b;
    }
    if (err == 9) {
      iVar8 = 1;
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        pcVar15 = "SSL_connect() -> want async";
        goto LAB_0016ba5f;
      }
      goto LAB_0016ba6b;
    }
    if (err == 2) {
      iVar8 = 1;
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        pcVar15 = "SSL_connect() -> want recv";
        goto LAB_0016ba5f;
      }
      goto LAB_0016ba6b;
    }
    memset(&neg_protocol,0,0x100);
    connssl->connecting_state = ssl_connect_2;
    uVar14 = ERR_get_error();
    uVar6 = (uint)uVar14;
    if ((uVar6 & 0xff800000) == 0xa000000 && -1 < (int)uVar6) {
      uVar6 = uVar6 & 0x7fffff;
      if (uVar6 != 0x86) {
        if (uVar6 == 0x45c) {
          pcVar15 = ossl_strerror(uVar14,(char *)&neg_protocol,0x100);
          Curl_failf(data,"TLS cert problem: %s",pcVar15);
          CVar7 = CURLE_SSL_CLIENTCERT;
          goto LAB_0016bba3;
        }
        if (uVar6 != 0x415) goto LAB_0016bbca;
      }
      lVar11 = SSL_get_verify_result((SSL *)puVar3[1]);
      if (lVar11 == 0) {
        pcVar17 = "%s";
        pcVar15 = "SSL certificate verification failed";
      }
      else {
        psVar10->certverifyresult = lVar11;
        pcVar15 = X509_verify_cert_error_string(lVar11);
        pcVar17 = "SSL certificate problem: %s";
      }
      Curl_failf(data,pcVar17,pcVar15);
      CVar7 = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
LAB_0016bbca:
      pcVar15 = ossl_strerror(uVar14,(char *)&neg_protocol,0x100);
      Curl_failf(data,"TLS connect error: %s",pcVar15);
      CVar7 = CURLE_SSL_CONNECT_ERROR;
      if (uVar14 == 0) {
        local_148 = 0;
        uStack_140 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_178 = 0;
        uStack_170 = 0;
        buf = (uchar *)0x0;
        uStack_180 = 0;
        piVar16 = __errno_location();
        if ((*piVar16 == 0) || (err != 5)) {
LAB_0016bc4c:
          buf_00 = (uchar **)SSL_ERROR_to_str(err);
        }
        else {
          buf_00 = &buf;
          Curl_strerror(*piVar16,(char *)buf_00,0x50);
          if ((char)buf == '\0') goto LAB_0016bc4c;
        }
        Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",buf_00,
                   (connssl->peer).hostname,(ulong)(uint)(connssl->peer).port);
      }
    }
  }
  else {
LAB_0016b87e:
    iVar8 = *(int *)((long)pvVar1 + 0xbc);
    if (iVar8 == 2) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"ossl_connect, step3");
      }
      pvVar18 = cf->ctx;
      CVar7 = Curl_oss_check_peer_cert
                        (cf,data,*(ossl_ctx **)((long)pvVar18 + 0x40),
                         (ssl_peer *)((long)pvVar18 + 8));
      if (CVar7 != CURLE_OK) {
        Curl_ssl_scache_remove_all(cf,data,*(char **)((long)pvVar18 + 0x20));
        goto LAB_0016bb97;
      }
      *(undefined4 *)((long)pvVar1 + 0xbc) = 3;
      if (*(int *)((long)pvVar1 + 0xc0) != 0) {
        iVar8 = SSL_get_early_data_status(*(undefined8 *)(*(long *)((long)pvVar1 + 0x40) + 8));
        *(uint *)((long)pvVar1 + 0xc0) = iVar8 == 2 ^ 5;
        iVar8 = *(int *)((long)pvVar1 + 0xbc);
        goto LAB_0016b94e;
      }
    }
    else {
LAB_0016b94e:
      if (iVar8 != 3) goto LAB_0016b99c;
    }
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
        (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, done");
    }
    *(undefined4 *)((long)pvVar1 + 0xb8) = 3;
LAB_0016b99c:
    CVar7 = CURLE_OK;
  }
LAB_0016bba3:
  CVar5 = CVar7;
  _Var4 = (*(uint *)((long)pvVar1 + 0xb8) & 0xfffffffd) == 1;
LAB_0016bbb5:
  *done = _Var4;
  return CVar5;
code_r0x0016b354:
  Curl_bufq_skip((bufq *)((long)pvVar18 + 0x68),0);
  goto LAB_0016b2c3;
}

Assistant:

static CURLcode ossl_connect(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  connssl->io_need = CURL_SSL_IO_NEED_NONE;

  if(ssl_connect_1 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step1");
    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_2 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step2");
#ifdef HAVE_OPENSSL_EARLYDATA
    if(connssl->earlydata_state == ssl_earlydata_await) {
      goto out;
    }
    else if(connssl->earlydata_state == ssl_earlydata_sending) {
      result = ossl_send_earlydata(cf, data);
      if(result)
        goto out;
      connssl->earlydata_state = ssl_earlydata_sent;
    }
#endif
    DEBUGASSERT((connssl->earlydata_state == ssl_earlydata_none) ||
                (connssl->earlydata_state == ssl_earlydata_sent));

    result = ossl_connect_step2(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_3 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step3");
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
    connssl->connecting_state = ssl_connect_done;
#ifdef HAVE_OPENSSL_EARLYDATA
    if(connssl->earlydata_state > ssl_earlydata_none) {
      struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
      /* We should be in this state by now */
      DEBUGASSERT(connssl->earlydata_state == ssl_earlydata_sent);
      connssl->earlydata_state =
        (SSL_get_early_data_status(octx->ssl) == SSL_EARLY_DATA_ACCEPTED) ?
        ssl_earlydata_accepted : ssl_earlydata_rejected;
    }
#endif
  }

  if(ssl_connect_done == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, done");
    connssl->state = ssl_connection_complete;
  }

out:
  if(result == CURLE_AGAIN) {
    *done = FALSE;
    return CURLE_OK;
  }
  *done = ((connssl->state == ssl_connection_complete) ||
           (connssl->state == ssl_connection_deferred));
  return result;
}